

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_grp.c
# Opt level: O0

int grpLoadEntries(PHYSFS_Io *io,PHYSFS_uint32 count,void *arc)

{
  int iVar1;
  void *pvVar2;
  PHYSFS_uint32 local_4c;
  char local_45;
  PHYSFS_uint32 size;
  char name [13];
  char *ptr;
  PHYSFS_uint32 i;
  PHYSFS_uint32 pos;
  void *arc_local;
  PHYSFS_uint32 count_local;
  PHYSFS_Io *io_local;
  
  ptr._4_4_ = count * 0x10 + 0x10;
  ptr._0_4_ = 0;
  while( true ) {
    if (count <= (uint)ptr) {
      return 1;
    }
    iVar1 = __PHYSFS_readAll(io,&local_45,0xc);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = __PHYSFS_readAll(io,&local_4c,4);
    if (iVar1 == 0) {
      return 0;
    }
    name[4] = '\0';
    name._5_8_ = strchr(&local_45,0x20);
    if ((char *)name._5_8_ != (char *)0x0) {
      *(char *)name._5_8_ = '\0';
    }
    local_4c = PHYSFS_swapULE32(local_4c);
    pvVar2 = UNPK_addEntry(arc,&local_45,0,-1,-1,(ulong)ptr._4_4_,(ulong)local_4c);
    if (pvVar2 == (void *)0x0) break;
    ptr._4_4_ = local_4c + ptr._4_4_;
    ptr._0_4_ = (uint)ptr + 1;
  }
  return 0;
}

Assistant:

static int grpLoadEntries(PHYSFS_Io *io, const PHYSFS_uint32 count, void *arc)
{
    PHYSFS_uint32 pos = 16 + (16 * count);  /* past sig+metadata. */
    PHYSFS_uint32 i;

    for (i = 0; i < count; i++)
    {
        char *ptr;
        char name[13];
        PHYSFS_uint32 size;
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, name, 12), 0);
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &size, 4), 0);

        name[12] = '\0';  /* name isn't null-terminated in file. */
        if ((ptr = strchr(name, ' ')) != NULL)
            *ptr = '\0';  /* trim extra spaces. */

        size = PHYSFS_swapULE32(size);
        BAIL_IF_ERRPASS(!UNPK_addEntry(arc, name, 0, -1, -1, pos, size), 0);

        pos += size;
    } /* for */

    return 1;
}